

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::create_expansion<false>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Siblings *siblings,
          Dictionary_it *s_h,Dictionary_it *next,Filtration_value *fil,int k,
          vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
          *added_simplices)

{
  Siblings *pSVar1;
  long lVar2;
  Siblings *siblings_00;
  pointer ppVar3;
  long *in_FS_OFFSET;
  iterator it;
  Simplex_handle root_sh;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ret_val_1;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ret_val;
  Dictionary_const_it local_40;
  Dictionary_const_it local_38;
  
  find_vertex((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&root_sh,(Vertex_handle)this);
  if ((char)in_FS_OFFSET[-5] == '\0') {
    in_FS_OFFSET[-6] = 0;
    in_FS_OFFSET[-8] = 0;
    in_FS_OFFSET[-7] = 0;
    __cxa_thread_atexit(std::
                        vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
                        ::~vector,*in_FS_OFFSET + -0x40,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -5) = 1;
  }
  pSVar1 = ((root_sh.m_ptr)->second).children_;
  if (pSVar1->parent_ == (root_sh.m_ptr)->first) {
    lVar2 = *in_FS_OFFSET;
    local_38.m_ptr = next->m_ptr;
    local_40.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)((siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
            (siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_size);
    ret_val.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)(pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    ret_val_1.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)((pointer)ret_val.m_ptr + (pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size);
    intersection<false>((vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
                         *)(lVar2 + -0x40),&local_38,&local_40,&ret_val,&ret_val_1,fil);
    if (in_FS_OFFSET[-7] == in_FS_OFFSET[-8]) {
      (s_h->m_ptr->second).children_ = siblings;
    }
    else {
      siblings_00 = (Siblings *)operator_new(0x28);
      Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>
      ::
      Simplex_tree_siblings<std::vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>>
                ((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>
                  *)siblings_00,siblings,s_h->m_ptr->first,
                 (vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
                  *)(lVar2 + -0x40));
      ppVar3 = (siblings_00->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      it.m_ptr = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                  *)ppVar3;
      while (it.m_ptr !=
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
              *)(ppVar3 + (siblings_00->members_).m_flat_tree.m_data.m_seq.m_holder.m_size)) {
        boost::container::
        vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
        ::operator++(&it);
        ppVar3 = (siblings_00->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      }
      if (in_FS_OFFSET[-7] != in_FS_OFFSET[-8]) {
        in_FS_OFFSET[-7] = in_FS_OFFSET[-8];
      }
      (s_h->m_ptr->second).children_ = siblings_00;
      siblings_expansion(this,siblings_00,k + -1);
    }
  }
  return;
}

Assistant:

void create_expansion(Siblings * siblings,
                        Dictionary_it& s_h,
                        Dictionary_it& next,
                        const Filtration_value& fil,
                        int k,
                        std::vector<Simplex_handle>* added_simplices = nullptr)
  {
    Simplex_handle root_sh = find_vertex(s_h->first);
    thread_local std::vector<std::pair<Vertex_handle, Node> > inter;

    if (!has_children(root_sh)) return;

    intersection<force_filtration_value>(
          inter,  // output intersection
          next,   // begin
          siblings->members().end(),  // end
          root_sh->second.children()->members().begin(),
          root_sh->second.children()->members().end(),
          fil);
    if (inter.size() != 0) {
      Siblings * new_sib = new Siblings(siblings,   // oncles
                                        s_h->first, // parent
                                        inter);     // boost::container::ordered_unique_range_t
      for (auto it = new_sib->members().begin(); it != new_sib->members().end(); ++it) {
        update_simplex_tree_after_node_insertion(it);
        if constexpr (force_filtration_value){
          //the way create_expansion is used, added_simplices != nullptr when force_filtration_value == true
          added_simplices->push_back(it);
        }
      }
      inter.clear();
      s_h->second.assign_children(new_sib);
      if constexpr (force_filtration_value){
        siblings_expansion(new_sib, fil, k - 1, *added_simplices);
      } else {
        siblings_expansion(new_sib, k - 1);
      }
    } else {
      // ensure the children property
      s_h->second.assign_children(siblings);
      inter.clear();
    }
  }